

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randtocsv.cpp
# Opt level: O0

void genrandomnumbers(bool skipheader,int total,int seed)

{
  result_type rVar1;
  result_type_conflict1 rVar2;
  int local_274c;
  OASIS_FLOAT f;
  int i;
  mt19937 mt;
  undefined1 local_13b0 [8];
  uniform_real_distribution<double> dis;
  random_device rd;
  int seed_local;
  int total_local;
  bool skipheader_local;
  
  std::random_device::random_device((random_device *)&dis._M_param._M_b);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)local_13b0,0.0,1.0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&f);
  if (seed < 1) {
    rVar1 = std::random_device::operator()((random_device *)&dis._M_param._M_b);
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)&f,(ulong)rVar1);
  }
  else {
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)&f,(long)seed);
  }
  if (!skipheader) {
    printf("\"random_no\"\n");
  }
  for (local_274c = 0; local_274c < total; local_274c = local_274c + 1) {
    rVar2 = std::uniform_real_distribution<double>::operator()
                      ((uniform_real_distribution<double> *)local_13b0,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)&f);
    printf("%f\n",(double)(float)rVar2);
  }
  std::random_device::~random_device((random_device *)&dis._M_param._M_b);
  return;
}

Assistant:

void genrandomnumbers(bool skipheader, int total, int seed)
{
	std::random_device rd;
	std::uniform_real_distribution<> dis(0, 1);
	std::mt19937 mt;
	if (seed > 0) mt.seed(seed);
	else mt.seed(rd());
	if (skipheader == false) printf("\"random_no\"\n");
	for (int i = 0; i < total; i++) {
		OASIS_FLOAT f = (OASIS_FLOAT)dis(mt);
		printf("%f\n", f);
	}
}